

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_buffer_method_reserve(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  
  TVar1 = recff_sbufx_check(J,rd,0);
  TVar2 = recff_sbufx_write(J,TVar1);
  TVar3 = recff_sbufx_checkint(J,rd,1);
  TVar2 = lj_ir_call(J,IRCALL_lj_bufx_more,(ulong)TVar2,(ulong)TVar3);
  J->base[1] = TVar2;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4509000e;
  TVar1 = lj_opt_fold(J);
  TVar1 = lj_crecord_topuint8(J,TVar1);
  *J->base = TVar1;
  rd->nres = 2;
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_reserve(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trbuf = recff_sbufx_write(J, ud);
  TRef trsz = recff_sbufx_checkint(J, rd, 1);
  J->base[1] = lj_ir_call(J, IRCALL_lj_bufx_more, trbuf, trsz);
  J->base[0] = lj_crecord_topuint8(J, recff_sbufx_get_ptr(J, ud, IRFL_SBUF_W));
  rd->nres = 2;
}